

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge-swap-reduce.cpp
# Opt level: O2

void median_reduce(Block *b,ReduceProxy *rp,RegularMergePartners *param_3)

{
  pointer pBVar1;
  pointer pPVar2;
  BlockID BVar3;
  int iVar4;
  mapped_type *pmVar5;
  mapped_type *pmVar6;
  int i;
  long lVar7;
  Point PVar8;
  int nbr_gid;
  BlockID local_78;
  uint round;
  Point med;
  vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_> medians;
  
  round = rp->round_;
  medians.super__Vector_base<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  medians.super__Vector_base<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  medians.super__Vector_base<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  Catch::clara::std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>::
  push_back(&medians,(b->points).
                     super__Vector_base<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish + -1);
  for (lVar7 = 0;
      pBVar1 = (rp->in_link_).neighbors_.
               super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
               super__Vector_impl_data._M_start,
      lVar7 < (int)((ulong)((long)(rp->in_link_).neighbors_.
                                  super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)pBVar1) >> 3);
      lVar7 = lVar7 + 1) {
    nbr_gid = pBVar1[lVar7].gid;
    if ((rp->super_Proxy).gid_ == nbr_gid) {
      med.super_array<float,_3UL>._M_elems[0] = (float)nbr_gid;
      fmt::v7::print<char[38],int,unsigned_int&,char>
                (_stderr,(char (*) [38])"[{}:{}] Skipping receiving from self\n",(int *)&med,&round)
      ;
    }
    else {
      diy::Point<float,_3U>::Point(&med);
      local_78.gid = nbr_gid;
      pmVar5 = Catch::clara::std::
               map<int,_diy::MemoryBuffer,_std::less<int>,_std::allocator<std::pair<const_int,_diy::MemoryBuffer>_>_>
               ::operator[](&(rp->super_Proxy).incoming_,&local_78.gid);
      (*(pmVar5->super_BinaryBuffer)._vptr_BinaryBuffer[4])(pmVar5,&med,0xc);
      local_78.gid = (rp->super_Proxy).gid_;
      fmt::v7::print<char[42],int,unsigned_int&,int&,char>
                (_stderr,(char (*) [42])"[{}:{}] Received median values from [{}]\n",&local_78.gid,
                 &round,&nbr_gid);
      Catch::clara::std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>::
      push_back(&medians,&med);
    }
  }
  PVar8 = compute_median(&medians);
  med.super_array<float,_3UL>._M_elems[2] = PVar8.super_array<float,_3UL>._M_elems[2];
  med.super_array<float,_3UL>._M_elems._0_8_ = PVar8.super_array<float,_3UL>._M_elems._0_8_;
  pPVar2 = (b->points).
           super__Vector_base<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pPVar2[-1].super_array<float,_3UL>._M_elems[2] = med.super_array<float,_3UL>._M_elems[2];
  *(undefined8 *)pPVar2[-1].super_array<float,_3UL>._M_elems =
       med.super_array<float,_3UL>._M_elems._0_8_;
  for (lVar7 = 0;
      pBVar1 = (rp->out_link_).neighbors_.
               super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
               super__Vector_impl_data._M_start,
      lVar7 < (int)((ulong)((long)(rp->out_link_).neighbors_.
                                  super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)pBVar1) >> 3);
      lVar7 = lVar7 + 1) {
    BVar3 = pBVar1[lVar7];
    iVar4 = BVar3.gid;
    if ((rp->super_Proxy).gid_ == iVar4) {
      local_78.gid = iVar4;
      fmt::v7::print<char[34],int,unsigned_int&,char>
                (_stderr,(char (*) [34])"[{}:{}] Skipping sending to self\n",&local_78.gid,&round);
    }
    else {
      local_78 = BVar3;
      pmVar6 = Catch::clara::std::
               map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
               ::operator[](&(rp->super_Proxy).outgoing_,&local_78);
      (*(pmVar6->super_BinaryBuffer)._vptr_BinaryBuffer[2])(pmVar6,&med,0xc);
      nbr_gid = (rp->super_Proxy).gid_;
      local_78 = (rp->out_link_).neighbors_.
                 super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar7];
      fmt::v7::print<char[29],int,unsigned_int&,int,char>
                (_stderr,(char (*) [29])"[{}:{}] Sent median to [{}]\n",&nbr_gid,&round,
                 &local_78.gid);
    }
  }
  Catch::clara::std::_Vector_base<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>::
  ~_Vector_base(&medians.
                 super__Vector_base<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>)
  ;
  return;
}

Assistant:

void median_reduce(Block* b,                                  // local block
                   const diy::ReduceProxy& rp,                // communication proxy
                   const diy::RegularMergePartners&)          // partners of the current block
{
    unsigned   round    = rp.round();               // current round number

    std::vector<Block::Point> medians;
    medians.push_back(b->points.back());

    // step 1: dequeue
    for (int i = 0; i < rp.in_link().size(); ++i)
    {
        int nbr_gid = rp.in_link().target(i).gid;
        if (nbr_gid == rp.gid())
        {
            fmt::print(stderr, "[{}:{}] Skipping receiving from self\n", rp.gid(), round);
            continue;
        }

        Block::Point med;
        rp.dequeue(nbr_gid, med);
        fmt::print(stderr, "[{}:{}] Received median values from [{}]\n",
                   rp.gid(), round, nbr_gid);
        medians.push_back(med);
    }

    // step 2 compute median
    Block::Point median = compute_median(medians);
    b->points.back() = median;

    // step 2: enqueue
    for (int i = 0; i < rp.out_link().size(); ++i)    // redundant since size should equal to 1
    {
        // only send to root of group, but not self
        if (rp.out_link().target(i).gid != rp.gid())
        {
            rp.enqueue(rp.out_link().target(i), median);
            fmt::print(stderr, "[{}:{}] Sent median to [{}]\n",
                       rp.gid(), round, rp.out_link().target(i).gid);
        } else {
            fmt::print(stderr, "[{}:{}] Skipping sending to self\n", rp.gid(), round);
        }
    }
}